

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpc.c
# Opt level: O0

mpc_err_t * mpc_err_new(mpc_input_t *i,char *expected)

{
  char cVar1;
  size_t sVar2;
  void *pvVar3;
  char *pcVar4;
  mpc_err_t *x;
  char *expected_local;
  mpc_input_t *i_local;
  
  if (i->suppress == 0) {
    i_local = (mpc_input_t *)mpc_malloc(i,0x48);
    sVar2 = strlen(i->filename);
    pvVar3 = mpc_malloc(i,sVar2 + 1);
    *(void **)&(i_local->state).term = pvVar3;
    strcpy(*(char **)&(i_local->state).term,i->filename);
    *(long *)i_local = (i->state).pos;
    i_local->filename = (char *)(i->state).row;
    (i_local->state).pos = (i->state).col;
    (i_local->state).row = *(long *)&(i->state).term;
    *(undefined4 *)&(i_local->state).col = 1;
    pcVar4 = (char *)mpc_malloc(i,8);
    i_local->buffer = pcVar4;
    sVar2 = strlen(expected);
    pvVar3 = mpc_malloc(i,sVar2 + 1);
    *(void **)i_local->buffer = pvVar3;
    strcpy(*(char **)i_local->buffer,expected);
    i_local->string = (char *)0x0;
    cVar1 = mpc_input_peekc(i);
    *(char *)&i_local->file = cVar1;
  }
  else {
    i_local = (mpc_input_t *)0x0;
  }
  return (mpc_err_t *)i_local;
}

Assistant:

static mpc_err_t *mpc_err_new(mpc_input_t *i, const char *expected) {
  mpc_err_t *x;
  if (i->suppress) { return NULL; }
  x = mpc_malloc(i, sizeof(mpc_err_t));
  x->filename = mpc_malloc(i, strlen(i->filename) + 1);
  strcpy(x->filename, i->filename);
  x->state = i->state;
  x->expected_num = 1;
  x->expected = mpc_malloc(i, sizeof(char*));
  x->expected[0] = mpc_malloc(i, strlen(expected) + 1);
  strcpy(x->expected[0], expected);
  x->failure = NULL;
  x->received = mpc_input_peekc(i);
  return x;
}